

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

FT_TrueTypeEngineType FT_Get_TrueType_Engine_Type(FT_Library library)

{
  FT_Module module;
  FT_TrueTypeEngineType *pFVar1;
  FT_TrueTypeEngineType FVar2;
  
  FVar2 = FT_TRUETYPE_ENGINE_TYPE_NONE;
  if (library != (FT_Library)0x0) {
    module = FT_Get_Module(library,"truetype");
    FVar2 = FT_TRUETYPE_ENGINE_TYPE_NONE;
    if (module != (FT_Module)0x0) {
      FVar2 = FT_TRUETYPE_ENGINE_TYPE_NONE;
      pFVar1 = (FT_TrueTypeEngineType *)ft_module_get_service(module,"truetype-engine",'\0');
      if (pFVar1 != (FT_TrueTypeEngineType *)0x0) {
        FVar2 = *pFVar1;
      }
    }
  }
  return FVar2;
}

Assistant:

FT_EXPORT_DEF( FT_TrueTypeEngineType )
  FT_Get_TrueType_Engine_Type( FT_Library  library )
  {
    FT_TrueTypeEngineType  result = FT_TRUETYPE_ENGINE_TYPE_NONE;


    if ( library )
    {
      FT_Module  module = FT_Get_Module( library, "truetype" );


      if ( module )
      {
        FT_Service_TrueTypeEngine  service;


        service = (FT_Service_TrueTypeEngine)
                    ft_module_get_service( module,
                                           FT_SERVICE_ID_TRUETYPE_ENGINE,
                                           0 );
        if ( service )
          result = service->engine_type;
      }
    }

    return result;
  }